

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_ParseSingleCharacterSpaceDelimitedValue_Test::
~CommandLineInterfaceTest_ParseSingleCharacterSpaceDelimitedValue_Test
          (CommandLineInterfaceTest_ParseSingleCharacterSpaceDelimitedValue_Test *this)

{
  CommandLineInterfaceTest_ParseSingleCharacterSpaceDelimitedValue_Test *this_local;
  
  ~CommandLineInterfaceTest_ParseSingleCharacterSpaceDelimitedValue_Test(this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ParseSingleCharacterSpaceDelimitedValue) {
  // Test that separating the flag value with a space works for
  // single-character flags.

  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");

  Run("protocol_compiler -t $tmpdir "
      "--proto_path=$tmpdir foo.proto");

  ExpectNoErrors();
  ExpectGenerated("test_generator", "", "foo.proto", "Foo");
}